

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LowerMDShared.cpp
# Opt level: O1

Instr * __thiscall LowererMD::LoadArgumentsFromFrame(LowererMD *this,Instr *instr)

{
  Func *pFVar1;
  code *pcVar2;
  bool bVar3;
  byte bVar4;
  undefined4 *puVar5;
  RegOpnd *baseOpnd;
  IndirOpnd *this_00;
  StackSym *sym;
  
  bVar3 = JITTimeWorkItem::IsLoopBody(this->m_func->m_workItem);
  pFVar1 = this->m_func;
  if (bVar3) {
    if (pFVar1->m_loopParamSym == (StackSym *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                         ,600,"(this->m_func->GetLoopParamSym())","this->m_func->GetLoopParamSym()")
      ;
      if (!bVar3) goto LAB_00658545;
      *puVar5 = 0;
    }
    baseOpnd = IR::RegOpnd::New(this->m_func->m_loopParamSym,TyInt64,this->m_func);
    this_00 = IR::IndirOpnd::New(baseOpnd,0x40,TyInt64,this->m_func,false);
  }
  else {
    sym = StackSym::New(TyInt64,pFVar1);
    sym->m_offset = -8;
    sym->field_0x19 = sym->field_0x19 | 0x10;
    this_00 = (IndirOpnd *)IR::SymOpnd::New(&sym->super_Sym,TyInt64,pFVar1);
  }
  if (instr->m_src1 != (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                       ,0x16c,"(this->m_src1 == __null)","Trying to overwrite existing src.");
    if (!bVar3) goto LAB_00658545;
    *puVar5 = 0;
  }
  pFVar1 = instr->m_func;
  if ((this_00->super_Opnd).isDeleted == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x14,"(!isDeleted)","Using deleted operand");
    if (!bVar3) {
LAB_00658545:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  bVar4 = (this_00->super_Opnd).field_0xb;
  if ((bVar4 & 2) != 0) {
    this_00 = (IndirOpnd *)IR::Opnd::Copy(&this_00->super_Opnd,pFVar1);
    bVar4 = (this_00->super_Opnd).field_0xb;
  }
  (this_00->super_Opnd).field_0xb = bVar4 | 2;
  instr->m_src1 = &this_00->super_Opnd;
  instr->m_opcode = MOV;
  return instr->m_prev;
}

Assistant:

IR::Instr *
LowererMD::LoadArgumentsFromFrame(IR::Instr * instr)
{
    if (this->m_func->IsLoopBody())
    {
        // Get the arguments ptr from the interpreter frame instance that was passed in.
        Assert(this->m_func->GetLoopParamSym());
        IR::RegOpnd *baseOpnd = IR::RegOpnd::New(this->m_func->GetLoopParamSym(), TyMachReg, this->m_func);
        int32 offset = (int32)Js::InterpreterStackFrame::GetOffsetOfArguments();
        instr->SetSrc1(IR::IndirOpnd::New(baseOpnd, offset, TyMachReg, this->m_func));
    }
    else
    {
        instr->SetSrc1(LowererMD::CreateStackArgumentsSlotOpnd(this->m_func));
    }

    instr->m_opcode = Js::OpCode::MOV;

    return instr->m_prev;
}